

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O0

long asn1_string_get_long(ASN1_STRING *a,int type)

{
  int iVar1;
  ASN1_STRING *local_28;
  int64_t v;
  ASN1_STRING *pAStack_18;
  int type_local;
  ASN1_STRING *a_local;
  
  if (a == (ASN1_STRING *)0x0) {
    a_local = (ASN1_STRING *)0x0;
  }
  else {
    v._4_4_ = type;
    pAStack_18 = a;
    iVar1 = asn1_string_get_int64((int64_t *)&local_28,a,type);
    if (((iVar1 == 0) || ((long)local_28 < -0x8000000000000000)) ||
       (0x7fffffffffffffff < (long)local_28)) {
      ERR_clear_error();
      a_local = (ASN1_STRING *)0xffffffffffffffff;
    }
    else {
      a_local = local_28;
    }
  }
  return (long)a_local;
}

Assistant:

static long asn1_string_get_long(const ASN1_STRING *a, int type) {
  if (a == NULL) {
    return 0;
  }

  int64_t v;
  if (!asn1_string_get_int64(&v, a, type) ||  //
      v < LONG_MIN || v > LONG_MAX) {
    // This function's return value does not distinguish overflow from -1.
    ERR_clear_error();
    return -1;
  }

  return (long)v;
}